

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nntree.cc
# Opt level: O2

void test_depth(void)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  reference pTVar6;
  undefined8 in_RCX;
  int n;
  string *psVar7;
  long lVar8;
  QUtil *this;
  QPDF q;
  string first;
  QPDFObjectHandle n3;
  QPDFObjectHandle n2;
  QPDFObjectHandle limits;
  _Variadic_union<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
  local_1a0;
  QPDFNameTreeObjectHelper nh;
  QPDFObjectHandle k2;
  QUtil *local_120;
  QUtil *local_118;
  QUtil *local_110;
  QPDFObjectHandle limits_2;
  QPDFObjectHandle local_e8;
  QPDFObjectHandle k1;
  QPDFObjectHandle n0;
  QPDFObjectHandle root;
  QPDFObjectHandle n1;
  QPDFObjectHandle k0;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_60;
  undefined1 local_50 [16];
  QPDFObjectHandle items;
  
  QPDF::QPDF(&q);
  QPDF::emptyPDF(&q);
  QPDF::getRoot((QPDF *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first,"/Kids",(allocator<char> *)&limits);
  new_node((QPDF *)&n0,(string *)&q);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first,"/NT",(allocator<char> *)&limits);
  QPDFObjectHandle::replaceKey(&root,&first,&n0);
  std::__cxx11::string::~string((string *)&first);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&first,"/NT",(allocator<char> *)&limits_2);
  QPDFObjectHandle::getKey((QPDFObjectHandle *)&nh,(string *)&root);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&limits,"/Kids",(allocator<char> *)&n1);
  QPDFObjectHandle::getKey(&k0,(string *)&nh);
  std::__cxx11::string::~string((string *)&limits);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &nh.super_QPDFObjectHelper.super_BaseHandle);
  std::__cxx11::string::~string((string *)&first);
  local_120 = (QUtil *)0x0;
  lVar4 = 0;
  do {
    if (lVar4 == 3) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_60,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&n0);
      QPDFNameTreeObjectHelper::QPDFNameTreeObjectHelper(&nh,(QPDFObjectHandle *)&local_60,&q,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
      poVar5 = std::operator<<((ostream *)&std::cout,"--- forward ---");
      std::endl<char,std::char_traits<char>>(poVar5);
      QPDFNameTreeObjectHelper::begin((iterator *)&first,&nh);
      QPDFNameTreeObjectHelper::end((iterator *)&limits,&nh);
      while( true ) {
        bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                          ((iterator *)&first,(iterator *)&limits);
        if (!bVar1) break;
        pTVar6 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)&first);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
        ::pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                *)&limits_2,pTVar6);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)&limits_2);
        poVar5 = std::operator<<(poVar5," -> ");
        QPDFObjectHandle::unparse_abi_cxx11_((string *)&n1,&local_e8);
        poVar5 = std::operator<<(poVar5,(string *)&n1);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&n1);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
                 *)&limits_2);
        QPDFNameTreeObjectHelper::iterator::operator++((iterator *)&first);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&limits);
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&first);
      poVar5 = std::operator<<((ostream *)&std::cout,"--- backward ---");
      std::endl<char,std::char_traits<char>>(poVar5);
      QPDFNameTreeObjectHelper::last((iterator *)&first,&nh);
      while( true ) {
        bVar1 = QPDFNameTreeObjectHelper::iterator::valid((iterator *)&first);
        if (!bVar1) break;
        pTVar6 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)&first);
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)pTVar6);
        poVar5 = std::operator<<(poVar5," -> ");
        pTVar6 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)&first);
        QPDFObjectHandle::unparse_abi_cxx11_((string *)&limits,&pTVar6->second);
        poVar5 = std::operator<<(poVar5,(string *)&limits);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)&limits);
        QPDFNameTreeObjectHelper::iterator::operator--((iterator *)&first);
      }
      QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000300",(allocator<char> *)&limits);
      check_find(&nh,&first,false);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000305",(allocator<char> *)&limits);
      check_find(&nh,&first,true);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000305",(allocator<char> *)&limits);
      check_find(&nh,&first,false);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"00000",(allocator<char> *)&limits);
      check_find(&nh,&first,false);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"00000",(allocator<char> *)&limits);
      check_find(&nh,&first,true);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000800",(allocator<char> *)&limits);
      check_find(&nh,&first,false);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000805",(allocator<char> *)&limits);
      check_find(&nh,&first,false);
      std::__cxx11::string::~string((string *)&first);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"000805",(allocator<char> *)&limits);
      check_find(&nh,&first,true);
      std::__cxx11::string::~string((string *)&first);
      QPDFNameTreeObjectHelper::~QPDFNameTreeObjectHelper(&nh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&k0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&n0.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&root.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDF::~QPDF(&q);
      return;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first,"/Kids",(allocator<char> *)&limits);
    new_node((QPDF *)&n1,(string *)&q);
    std::__cxx11::string::~string((string *)&first);
    QPDFObjectHandle::appendItem(&k0,&n1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first,"/Kids",(allocator<char> *)&limits);
    QPDFObjectHandle::getKey(&k1,(string *)&n1);
    std::__cxx11::string::~string((string *)&first);
    local_118 = local_120;
    lVar3 = 0;
    while( true ) {
      n = (int)(string *)&limits_2;
      if (lVar3 == 3) break;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"/Kids",(allocator<char> *)&limits);
      new_node((QPDF *)&n2,(string *)&q);
      std::__cxx11::string::~string((string *)&first);
      QPDFObjectHandle::appendItem(&k1,&n2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"/Kids",(allocator<char> *)&limits);
      QPDFObjectHandle::getKey(&k2,(string *)&n2);
      std::__cxx11::string::~string((string *)&first);
      local_110 = local_118;
      for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&first,"/Names",(allocator<char> *)&limits);
        new_node((QPDF *)&n3,(string *)&q);
        std::__cxx11::string::~string((string *)&first);
        QPDFObjectHandle::appendItem(&k2,&n3);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&first,"/Names",(allocator<char> *)&limits);
        QPDFObjectHandle::getKey(&items,(string *)&n3);
        std::__cxx11::string::~string((string *)&first);
        first._M_dataplus._M_p = (pointer)&first.field_2;
        first._M_string_length = 0;
        limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)&local_1a0;
        limits.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        first.field_2._M_local_buf[0] = '\0';
        local_1a0._0_1_ = 0;
        this = local_110;
        for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
          QUtil::int_to_string_abi_cxx11_((string *)&nh,this,6,(int)in_RCX);
          QPDFObjectHandle::newString((string *)&limits_2);
          QPDFObjectHandle::appendItem(&items,&limits_2);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&limits_2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::operator+((string *)&limits_2,"val ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nh);
          QPDFObjectHandle::newString((string *)local_50);
          QPDFObjectHandle::appendItem(&items,(QPDFObjectHandle *)local_50);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
          std::__cxx11::string::~string((string *)&limits_2);
          psVar7 = (string *)&limits;
          if ((int)lVar8 == 2) {
LAB_0011c037:
            std::__cxx11::string::_M_assign((string *)psVar7);
          }
          else if ((int)lVar8 == 0) {
            psVar7 = &first;
            goto LAB_0011c037;
          }
          std::__cxx11::string::~string((string *)&nh);
          this = this + 10;
        }
        QPDFObjectHandle::newArray();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&nh,"/Limits",(allocator<char> *)local_50);
        QPDFObjectHandle::replaceKey(&n3,(string *)&nh,&limits_2);
        std::__cxx11::string::~string((string *)&nh);
        QPDFObjectHandle::newString((string *)&nh);
        QPDFObjectHandle::appendItem(&limits_2,(QPDFObjectHandle *)&nh);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &nh.super_QPDFObjectHelper.super_BaseHandle);
        QPDFObjectHandle::newString((string *)&nh);
        QPDFObjectHandle::appendItem(&limits_2,(QPDFObjectHandle *)&nh);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &nh.super_QPDFObjectHelper.super_BaseHandle);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&limits_2.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::~string((string *)&limits);
        std::__cxx11::string::~string((string *)&first);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&items.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&n3.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        local_110 = local_110 + 0x1e;
      }
      QPDFObjectHandle::newArray();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"/Limits",(allocator<char> *)&nh);
      QPDFObjectHandle::replaceKey(&n2,&first,&limits);
      std::__cxx11::string::~string((string *)&first);
      QPDFObjectHandle::getArrayItem(&n3,(int)&k2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"/Limits",(allocator<char> *)&items);
      QPDFObjectHandle::getKey(&limits_2,(string *)&n3);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&nh,n);
      QPDFObjectHandle::appendItem(&limits,(QPDFObjectHandle *)&nh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &nh.super_QPDFObjectHelper.super_BaseHandle);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&limits_2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&first);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&n3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      QPDFObjectHandle::getArrayItem(&n3,(int)&k2);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&first,"/Limits",(allocator<char> *)&items);
      QPDFObjectHandle::getKey(&limits_2,(string *)&n3);
      QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&nh,n);
      QPDFObjectHandle::appendItem(&limits,(QPDFObjectHandle *)&nh);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &nh.super_QPDFObjectHelper.super_BaseHandle);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&limits_2.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::~string((string *)&first);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&n3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&limits.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&k2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      lVar3 = lVar3 + 1;
      local_118 = local_118 + 0x5a;
    }
    QPDFObjectHandle::newArray();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first,"/Limits",(allocator<char> *)&nh);
    QPDFObjectHandle::replaceKey(&n1,&first,&limits);
    std::__cxx11::string::~string((string *)&first);
    QPDFObjectHandle::getArrayItem(&n2,(int)&k1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first,"/Limits",(allocator<char> *)&k2);
    QPDFObjectHandle::getKey(&limits_2,(string *)&n2);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&nh,n);
    QPDFObjectHandle::appendItem(&limits,(QPDFObjectHandle *)&nh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &nh.super_QPDFObjectHelper.super_BaseHandle);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&limits_2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&first);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    QPDFObjectHandle::getArrayItem(&n2,(int)&k1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&first,"/Limits",(allocator<char> *)&k2);
    QPDFObjectHandle::getKey(&limits_2,(string *)&n2);
    QPDFObjectHandle::getArrayItem((QPDFObjectHandle *)&nh,n);
    QPDFObjectHandle::appendItem(&limits,(QPDFObjectHandle *)&nh);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &nh.super_QPDFObjectHelper.super_BaseHandle);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&limits_2.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::~string((string *)&first);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&n2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&limits.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&k1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&n1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    lVar4 = lVar4 + 1;
    local_120 = local_120 + 0x10e;
  } while( true );
}

Assistant:

void
test_depth()
{
    int constexpr NITEMS = 3;
    QPDF q;
    q.emptyPDF();
    auto root = q.getRoot();
    auto n0 = new_node(q, "/Kids");
    root.replaceKey("/NT", n0);
    auto k0 = root.getKey("/NT").getKey("/Kids");
    for (int i1 = 0; i1 < NITEMS; ++i1) {
        auto n1 = new_node(q, "/Kids");
        k0.appendItem(n1);
        auto k1 = n1.getKey("/Kids");
        for (int i2 = 0; i2 < NITEMS; ++i2) {
            auto n2 = new_node(q, "/Kids");
            k1.appendItem(n2);
            auto k2 = n2.getKey("/Kids");
            for (int i3 = 0; i3 < NITEMS; ++i3) {
                auto n3 = new_node(q, "/Names");
                k2.appendItem(n3);
                auto items = n3.getKey("/Names");
                std::string first;
                std::string last;
                for (int i4 = 0; i4 < NITEMS; ++i4) {
                    int val = (((((i1 * NITEMS) + i2) * NITEMS) + i3) * NITEMS) + i4;
                    std::string str = QUtil::int_to_string(10 * val, 6);
                    items.appendItem(QPDFObjectHandle::newString(str));
                    items.appendItem(QPDFObjectHandle::newString("val " + str));
                    if (i4 == 0) {
                        first = str;
                    } else if (i4 == NITEMS - 1) {
                        last = str;
                    }
                }
                auto limits = QPDFObjectHandle::newArray();
                n3.replaceKey("/Limits", limits);
                limits.appendItem(QPDFObjectHandle::newString(first));
                limits.appendItem(QPDFObjectHandle::newString(last));
            }
            auto limits = QPDFObjectHandle::newArray();
            n2.replaceKey("/Limits", limits);
            limits.appendItem(k2.getArrayItem(0).getKey("/Limits").getArrayItem(0));
            limits.appendItem(k2.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
        }
        auto limits = QPDFObjectHandle::newArray();
        n1.replaceKey("/Limits", limits);
        limits.appendItem(k1.getArrayItem(0).getKey("/Limits").getArrayItem(0));
        limits.appendItem(k1.getArrayItem(NITEMS - 1).getKey("/Limits").getArrayItem(1));
    }

    QPDFNameTreeObjectHelper nh(n0, q);
    std::cout << "--- forward ---" << std::endl;
    for (auto i: nh) {
        std::cout << i.first << " -> " << i.second.unparse() << std::endl;
    }
    std::cout << "--- backward ---" << std::endl;
    for (auto i = nh.last(); i.valid(); --i) {
        std::cout << (*i).first << " -> " << (*i).second.unparse() << std::endl;
    }

    // Find
    check_find(nh, "000300", false);
    check_find(nh, "000305", true);
    check_find(nh, "000305", false);
    check_find(nh, "00000", false);
    check_find(nh, "00000", true);
    check_find(nh, "000800", false);
    check_find(nh, "000805", false);
    check_find(nh, "000805", true);
}